

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O1

int ffbins(char *binspec,int *imagetype,int *histaxis,char (*colname) [71],double *minin,
          double *maxin,double *binsizein,char (*minname) [71],char (*maxname) [71],
          char (*binname) [71],double *wt,char *wtname,int *recip,int *status)

{
  int iVar1;
  
  iVar1 = ffbinse(binspec,imagetype,histaxis,colname,minin,maxin,binsizein,minname,maxname,binname,
                  wt,wtname,recip,(char ***)0x0,status);
  return iVar1;
}

Assistant:

int ffbins(char *binspec,   /* I - binning specification */
                   int *imagetype,      /* O - image type, TINT or TSHORT */
                   int *histaxis,       /* O - no. of axes in the histogram */
                   char colname[4][FLEN_VALUE],  /* column name for axis */
                   double *minin,        /* minimum value for each axis */
                   double *maxin,        /* maximum value for each axis */
                   double *binsizein,    /* size of bins on each axis */
                   char minname[4][FLEN_VALUE],  /* keyword name for min */
                   char maxname[4][FLEN_VALUE],  /* keyword name for max */
                   char binname[4][FLEN_VALUE],  /* keyword name for binsize */
                   double *wt,          /* weighting factor          */
                   char *wtname,        /* keyword or column name for weight */
                   int *recip,          /* the reciprocal of the weight? */
                   int *status)
{
  /* Parse non-extended expression, but otherwise the same as ffbinse() */

  return ffbinse(binspec, 
		 imagetype, histaxis, colname,
		 minin, maxin, binsizein, 
		 minname, maxname, binname,
		 wt, wtname, recip,
		 0, /* No exprs pointer */
		 status);
		 
}